

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O3

void __thiscall duckdb::ProducerToken::~ProducerToken(ProducerToken *this)

{
  _Head_base<0UL,_duckdb::QueueProducerToken_*,_false> _Var1;
  QueueProducerToken QVar2;
  
  _Var1._M_head_impl =
       (this->token).
       super_unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QueueProducerToken_*,_std::default_delete<duckdb::QueueProducerToken>_>
       .super__Head_base<0UL,_duckdb::QueueProducerToken_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (QueueProducerToken *)0x0) {
    QVar2.queue_token.producer = (_Var1._M_head_impl)->queue_token;
    if (QVar2.queue_token.producer != (ConcurrentQueueProducerTypelessBase *)0x0) {
      *(undefined8 *)((long)QVar2.queue_token.producer + 0x10) = 0;
      *(undefined1 *)((long)QVar2.queue_token.producer + 8) = 1;
    }
    operator_delete(_Var1._M_head_impl);
  }
  (this->token).
  super_unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::QueueProducerToken_*,_std::default_delete<duckdb::QueueProducerToken>_>
  .super__Head_base<0UL,_duckdb::QueueProducerToken_*,_false>._M_head_impl =
       (QueueProducerToken *)0x0;
  return;
}

Assistant:

ProducerToken::~ProducerToken() {
}